

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
* Catch::Generators::
  makeGenerators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            (binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
             *val,binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
                  *moreGenerators,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_1,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_2,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_3,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_4,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_5,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_6,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_7,
            binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
            *moreGenerators_8)

{
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *in_RDX;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *unaff_RBX;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *in_RSI;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *in_RDI;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *unaff_R14;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *moreGenerators_2_00;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *value;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *in_stack_ffffffffffffffa0;
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  *in_stack_ffffffffffffffa8;
  binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
  *moreGenerators_6_00;
  
  value = (binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>
           *)&stack0xffffffffffffffb0;
  moreGenerators_2_00 = in_RDI;
  moreGenerators_6_00 = in_RDI;
  value<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            (value);
  makeGenerators<binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>,binary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128,trng::portable_impl::uint128>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,value,moreGenerators_2_00,in_RDI,
             in_RDX,in_RSI,moreGenerators_6_00,unaff_RBX,unaff_R14);
  GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  ::~GeneratorWrapper((GeneratorWrapper<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
                       *)0x441599);
  return (Generators<binary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
          *)in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }